

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefaultDistItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultDistItemSyntax,slang::syntax::DefaultDistItemSyntax_const&>
          (BumpAllocator *this,DefaultDistItemSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  DistWeightSyntax *pDVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  DefaultDistItemSyntax *pDVar10;
  
  pDVar10 = (DefaultDistItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultDistItemSyntax *)this->endPtr < pDVar10 + 1) {
    pDVar10 = (DefaultDistItemSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pDVar10 + 1);
  }
  SVar8 = (args->super_DistItemBaseSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_DistItemBaseSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DistItemBaseSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_DistItemBaseSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->defaultKeyword).kind;
  uVar5 = (args->defaultKeyword).field_0x2;
  NVar6.raw = (args->defaultKeyword).numFlags.raw;
  uVar7 = (args->defaultKeyword).rawLen;
  pDVar3 = args->weight;
  (pDVar10->defaultKeyword).info = (args->defaultKeyword).info;
  pDVar10->weight = pDVar3;
  (pDVar10->super_DistItemBaseSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar10->defaultKeyword).kind = TVar4;
  (pDVar10->defaultKeyword).field_0x2 = uVar5;
  (pDVar10->defaultKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar10->defaultKeyword).rawLen = uVar7;
  (pDVar10->super_DistItemBaseSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pDVar10->super_DistItemBaseSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pDVar10->super_DistItemBaseSyntax).super_SyntaxNode.parent = pSVar1;
  return pDVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }